

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flstring.c
# Opt level: O0

int fl_ascii_strcasecmp(char *s,char *t)

{
  bool bVar1;
  int local_2c;
  int local_24;
  char *local_20;
  char *t_local;
  char *s_local;
  
  if ((s == (char *)0x0) || (local_20 = t, t_local = s, t == (char *)0x0)) {
    if (s == t) {
      local_24 = 0;
    }
    else {
      local_24 = 1;
      if (s == (char *)0x0) {
        local_24 = -1;
      }
    }
    return local_24;
  }
  while( true ) {
    bVar1 = false;
    if (*t_local != '\0') {
      bVar1 = *local_20 != '\0';
    }
    if (!bVar1) break;
    if (*t_local != *local_20) {
      if (*t_local < *local_20) {
        if (((*t_local + 0x20 != (int)*local_20) || (*t_local < 'A')) || ('Z' < *t_local)) {
          return -1;
        }
      }
      else if (((*t_local + -0x20 != (int)*local_20) || (*t_local < 'a')) || ('z' < *t_local)) {
        return 1;
      }
    }
    t_local = t_local + 1;
    local_20 = local_20 + 1;
  }
  if (*t_local == *local_20) {
    local_2c = 0;
  }
  else {
    local_2c = 1;
    if (*local_20 != '\0') {
      local_2c = -1;
    }
  }
  return local_2c;
}

Assistant:

int fl_ascii_strcasecmp(const char *s, const char *t) {
  if (!s || !t) return (s==t ? 0 : (!s ? -1 : +1));
  
  for(;*s && *t; s++,t++) {
    if (*s == *t) continue;
    if (*s < *t) {
      if ( (*s+0x20)!=*t || !C_RANGE(*s,'A','Z') ) return -1;
    } else { 	/* (*s > *t) */
      if ( (*s-0x20)!=*t || !C_RANGE(*s,'a','z') ) return +1;
    }
  }
  return (*s==*t) ? 0 : (*t ? -1 : +1);
}